

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModifiedPage.cpp
# Opt level: O0

void __thiscall
PDFModifiedPage::PDFModifiedPage
          (PDFModifiedPage *this,PDFWriter *inWriter,unsigned_long inPageIndex,
          bool inEnsureContentEncapsulation)

{
  bool inEnsureContentEncapsulation_local;
  unsigned_long inPageIndex_local;
  PDFWriter *inWriter_local;
  PDFModifiedPage *this_local;
  
  std::vector<PDFFormXObject_*,_std::allocator<PDFFormXObject_*>_>::vector(&this->mContenxts);
  this->mWriter = inWriter;
  this->mPageIndex = inPageIndex;
  this->mCurrentContext = (PDFFormXObject *)0x0;
  this->mEnsureContentEncapsulation = inEnsureContentEncapsulation;
  this->mIsDirty = false;
  return;
}

Assistant:

PDFModifiedPage::PDFModifiedPage(PDFWriter* inWriter,unsigned long inPageIndex,bool inEnsureContentEncapsulation)
{
	mWriter = inWriter;
	mPageIndex = inPageIndex;
	mCurrentContext = NULL;
	mEnsureContentEncapsulation = inEnsureContentEncapsulation;
	mIsDirty = false;
}